

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O1

void __thiscall TreeOram::TreeOram(TreeOram *this,int _logN,int buck_size,int _h)

{
  pointer *pppBVar1;
  iterator iVar2;
  pointer piVar3;
  result_type rVar4;
  long lVar5;
  Bucket<int> *pBVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  Bucket<int> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_38 = &this->index;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rg)._M_x[0] = 0x1571;
  uVar7 = 0x1571;
  lVar5 = 7;
  do {
    uVar7 = (ulong)((((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar5) - 6);
    (this->rg)._M_x[lVar5 + -6] = uVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x276);
  (this->rg)._M_p = 0x270;
  (this->uni)._M_param = (param_type)0x7fffffff00000000;
  uVar7 = time((time_t *)0x0);
  uVar7 = uVar7 & 0xffffffff;
  (this->rg)._M_x[0] = uVar7;
  lVar5 = 7;
  do {
    uVar7 = (ulong)((((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar5) - 6);
    (this->rg)._M_x[lVar5 + -6] = uVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x276);
  (this->rg)._M_p = 0x270;
  this->logN = _logN;
  this->h = _h;
  this->N = 1 << ((byte)_logN & 0x1f);
  (this->uni)._M_param = (param_type)((ulong)(uint)~(-1 << ((char)_h - 1U & 0x1f)) << 0x20);
  pBVar6 = (Bucket<int> *)operator_new(0x20);
  Bucket<int>::Bucket(pBVar6,0x32);
  iVar2._M_current =
       (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40 = pBVar6;
  if (iVar2._M_current ==
      (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Bucket<int>*,std::allocator<Bucket<int>*>>::_M_realloc_insert<Bucket<int>*>
              ((vector<Bucket<int>*,std::allocator<Bucket<int>*>> *)this,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = pBVar6;
    pppBVar1 = &(this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  iVar9 = 1;
  if (1 < 1 << ((byte)this->h & 0x1f)) {
    do {
      pBVar6 = (Bucket<int> *)operator_new(0x20);
      Bucket<int>::Bucket(pBVar6,buck_size);
      iVar2._M_current =
           (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_40 = pBVar6;
      if (iVar2._M_current ==
          (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Bucket<int>*,std::allocator<Bucket<int>*>>::_M_realloc_insert<Bucket<int>*>
                  ((vector<Bucket<int>*,std::allocator<Bucket<int>*>> *)this,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = pBVar6;
        pppBVar1 = &(this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < 1 << ((byte)this->h & 0x1f));
  }
  local_40 = (Bucket<int> *)CONCAT44(local_40._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (local_38,(long)this->N + 1,(value_type_conflict *)&local_40);
  if ((this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar8 = 1;
    uVar7 = 0;
    do {
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (&this->uni,&this->rg,&(this->uni)._M_param);
      piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3[uVar7] = rVar4;
      uVar7 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar7 < (ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
  }
  this->stash = *(this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

TreeOram(int _logN, int buck_size, int _h)
      {
         rg.seed(time(0));
         logN = _logN;
         h = _h;
         N = 1<<logN;
         uni = std::uniform_int_distribution<int>(0, (1<<(h-1))-1);
         tree.push_back(new Bucket<int>(STASH_CAP));
         for(int i = 1; i < 1<<h; ++i)
            tree.push_back(new Bucket<int>(buck_size));
         index.assign(N+1, -1);
         for(unsigned int i = 0; i < index.size(); ++i)
            index[i] = uni(rg);
         stash = tree[0];
      }